

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O1

void __thiscall
PFData_test_loadClipTest2_Test::~PFData_test_loadClipTest2_Test
          (PFData_test_loadClipTest2_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(PFData_test, loadClipTest2){

    // this file needs to exist, and should load
    char filename[2048];
    getcwd(filename,2048);
    strcat(filename,"/tests/inputs/press.init.pfb");
    PFData test(filename);
    int retval = test.loadHeader();
    ASSERT_EQ(0,retval);
    retval = test.loadClipOfData(39,39,2,2);
    ASSERT_EQ(0,retval);
    double* data = test.getData();
    EXPECT_NE(nullptr, data);
    EXPECT_EQ(50, test.getNZ());
    EXPECT_EQ(2, test.getNY());
    EXPECT_EQ(2, test.getNX());
    EXPECT_EQ(0, test.getZ());
    EXPECT_EQ(39, test.getY());
    EXPECT_EQ(39, test.getX());
    EXPECT_NEAR(95.173603867758615, test(0, 1, 1), 1E-12);
    EXPECT_NEAR(98.006254316614971, test(0, 0, 0), 1E-12);
    test.close();
}